

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bigfile.c
# Opt level: O2

int big_block_grow(BigBlock *bb,int Nfile_grow,size_t *fsize_grow)

{
  FILE *__stream;
  int fileid;
  
  fileid = bb->Nfile;
  _big_block_grow_internal(bb,Nfile_grow,fsize_grow);
  while( true ) {
    if (bb->Nfile <= fileid) {
      return 0;
    }
    __stream = (FILE *)_big_file_open_a_file(bb->basename,fileid,"w",1);
    if (__stream == (FILE *)0x0) break;
    fclose(__stream);
    fileid = fileid + 1;
  }
  _big_file_raise((char *)0x0,
                  "/workspace/llm4binary/github/license_c_cmakelists/rainwoodman[P]bigfile/src/bigfile.c"
                  ,0x1cf);
  return -1;
}

Assistant:

int
big_block_grow(BigBlock * bb, int Nfile_grow, const size_t fsize_grow[])
{
    int oldNfile = bb->Nfile;

    _big_block_grow_internal(bb, Nfile_grow, fsize_grow);

    int i;

    /* now truncate the new files */
    for(i = oldNfile; i < bb->Nfile; i ++) {
        FILE * fp = _big_file_open_a_file(bb->basename, i, "w", 1);
        RAISEIF(fp == NULL, 
                ex_fileio, 
                NULL);
        fclose(fp);
    }
    return 0;

ex_fileio:
    return -1;
}